

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

Index __thiscall
PlanningUnitMADPDiscrete::GetJointObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *jointObservations)

{
  Index *indices;
  Index IVar1;
  int iVar2;
  const_reference pvVar3;
  undefined4 extraout_var;
  PlanningUnitMADPDiscrete *this_00;
  
  pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     (&this->_m_firstJOHIforT,(ulong)t);
  IVar1 = Globals::CastLIndexToIndex(*pvVar3);
  this_00 = (PlanningUnitMADPDiscrete *)this->_m_madp;
  indices = (jointObservations->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
            _M_impl.super__Vector_impl_data._M_start;
  iVar2 = (*(this_00->super_PlanningUnit)._vptr_PlanningUnit[0x19])();
  IVar1 = ComputeHistoryIndex(this_00,t,IVar1,indices,CONCAT44(extraout_var,iVar2));
  return IVar1;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetJointObservationHistoryIndex(
        Index t, const vector<Index>& jointObservations) const
{
    return( ComputeHistoryIndex(
                t, 
                CastLIndexToIndex(_m_firstJOHIforT.at(t)), 
                &jointObservations[0],
                GetNrJointObservations()
                )
          );    
/*
    size_t this_JOHI=_m_firstJOHIforT.at(t);
    size_t nrJO = GetNrJointObservations();
    for (Index ts=0; ts<t; ts++)
    {
        int exponent = t-1 - ts;
        size_t b = (size_t) pow((double)nrJO, (double)(exponent));
        this_JOHI += jointObservations.at(ts) * b;
    }
    return(this_JOHI);*/
}